

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

int __thiscall Item::operator[](Item *this,int i)

{
  runtime_error *this_00;
  char _error_msg_ [256];
  char acStack_118 [264];
  
  if (i < this->ndims) {
    return (this->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[i];
  }
  snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","i < ndims",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
           ,0x1e);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,acStack_118);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Item::operator[](int i) const {
	throw_assert(i < ndims);
	return w[i];
}